

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KdTree.cpp
# Opt level: O1

void __thiscall RVO::KdTree::buildAgentTree(KdTree *this)

{
  pointer *pppAVar1;
  iterator __position;
  pointer ppAVar2;
  pointer ppAVar3;
  ulong uVar4;
  long lVar5;
  
  uVar4 = (long)(this->agents_).super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(this->agents_).super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
  if (uVar4 < (ulong)((long)(this->sim_->agents_).
                            super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)(this->sim_->agents_).
                           super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>._M_impl.
                           super__Vector_impl_data._M_start)) {
    ppAVar3 = (this->sim_->agents_).super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (uVar4 < (ulong)((long)(this->sim_->agents_).
                              super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)ppAVar3)) {
      uVar4 = (long)uVar4 >> 3;
      lVar5 = uVar4 * 8;
      do {
        __position._M_current =
             (this->agents_).super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>._M_impl
             .super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->agents_).super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<RVO::Agent*,std::allocator<RVO::Agent*>>::_M_realloc_insert<RVO::Agent*const&>
                    ((vector<RVO::Agent*,std::allocator<RVO::Agent*>> *)this,__position,
                     (Agent **)((long)ppAVar3 + lVar5));
        }
        else {
          *__position._M_current = *(Agent **)((long)ppAVar3 + lVar5);
          pppAVar1 = &(this->agents_).
                      super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          *pppAVar1 = *pppAVar1 + 1;
        }
        uVar4 = uVar4 + 1;
        ppAVar3 = (this->sim_->agents_).
                  super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        lVar5 = lVar5 + 8;
      } while (uVar4 < (ulong)((long)(this->sim_->agents_).
                                     super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)ppAVar3 >> 3
                              ));
    }
    std::vector<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>::resize
              (&this->agentTree_,
               ((long)(this->agents_).
                      super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(this->agents_).
                      super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>._M_impl.
                      super__Vector_impl_data._M_start >> 2) - 1);
  }
  ppAVar3 = (this->agents_).super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppAVar2 = (this->agents_).super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppAVar3 != ppAVar2) {
    buildAgentTreeRecursive(this,0,(long)ppAVar2 - (long)ppAVar3 >> 3,0);
    return;
  }
  return;
}

Assistant:

void KdTree::buildAgentTree()
	{
		if (agents_.size() < sim_->agents_.size()) {
			for (size_t i = agents_.size(); i < sim_->agents_.size(); ++i) {
				agents_.push_back(sim_->agents_[i]);
			}

			agentTree_.resize(2 * agents_.size() - 1);
		}

		if (!agents_.empty()) {
			buildAgentTreeRecursive(0, agents_.size(), 0);
		}
	}